

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O0

Vec3f __thiscall embree::XMLLoader::load<embree::Vec3<float>>(XMLLoader *this,Ref<embree::XML> *xml)

{
  size_type sVar1;
  runtime_error *this_00;
  long *in_RDX;
  float *in_RDI;
  float fVar2;
  float fVar3;
  undefined4 in_XMM1_Da;
  Vec3f VVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  undefined1 in_stack_ffffffffffffff77;
  Token *in_stack_ffffffffffffff78;
  string local_80 [32];
  long *local_60;
  long *local_48;
  long *local_40;
  ParseLocation *in_stack_ffffffffffffffc8;
  
  local_60 = in_RDX;
  sVar1 = std::vector<embree::Token,_std::allocator<embree::Token>_>::size
                    ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*in_RDX + 0x98));
  if (sVar1 != 3) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*local_60;
    ParseLocation::str_abi_cxx11_(in_stack_ffffffffffffffc8);
    std::operator+(__lhs,(char *)this_00);
    std::runtime_error::runtime_error(this_00,local_80);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::vector<embree::Token,_std::allocator<embree::Token>_>::operator[]
            ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*local_60 + 0x98),0);
  fVar2 = Token::Float(in_stack_ffffffffffffff78,(bool)in_stack_ffffffffffffff77);
  local_40 = local_60;
  std::vector<embree::Token,_std::allocator<embree::Token>_>::operator[]
            ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*local_60 + 0x98),1);
  fVar3 = Token::Float(in_stack_ffffffffffffff78,(bool)in_stack_ffffffffffffff77);
  local_48 = local_60;
  std::vector<embree::Token,_std::allocator<embree::Token>_>::operator[]
            ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*local_60 + 0x98),2);
  VVar4.field_0._0_4_ = Token::Float(in_stack_ffffffffffffff78,(bool)in_stack_ffffffffffffff77);
  *in_RDI = fVar2;
  in_RDI[1] = fVar3;
  VVar4.field_0.field_0.y = 0.0;
  in_RDI[2] = VVar4.field_0._0_4_;
  VVar4.field_0.field_0.z = (float)in_XMM1_Da;
  return (Vec3f)VVar4.field_0;
}

Assistant:

Vec3f XMLLoader::load<Vec3f>(const Ref<XML>& xml) {
    if (xml->body.size() != 3) THROW_RUNTIME_ERROR(xml->loc.str()+": wrong float3 body");
    return Vec3f(xml->body[0].Float(),xml->body[1].Float(),xml->body[2].Float());
  }